

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitem.cpp
# Opt level: O0

QDebug operator<<(QDebug *debug,QGraphicsItem *item)

{
  bool bVar1;
  QGraphicsObject *pQVar2;
  QGraphicsProxyWidget *pQVar3;
  long in_RDX;
  QGraphicsItem *in_RSI;
  QGraphicsItem *in_RDI;
  long in_FS_OFFSET;
  QWidget *w;
  QGraphicsProxyWidget *pw;
  QGraphicsObject *o;
  QDebugStateSaver saver;
  QDebug *in_stack_ffffffffffffff58;
  undefined7 in_stack_ffffffffffffff60;
  byte in_stack_ffffffffffffff67;
  QGraphicsItem *item_00;
  QWidget *in_stack_ffffffffffffff80;
  QGraphicsItem *t;
  QDebug local_48 [7];
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_10 = &DAT_aaaaaaaaaaaaaaaa;
  item_00 = in_RDI;
  t = in_RSI;
  QDebugStateSaver::QDebugStateSaver((QDebugStateSaver *)&local_10,(QDebug *)in_RSI);
  QDebug::nospace((QDebug *)in_RSI);
  if (in_RDX == 0) {
    QDebug::operator<<((QDebug *)in_RSI,(char *)t);
    QDebug::QDebug((QDebug *)CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60),
                   in_stack_ffffffffffffff58);
  }
  else {
    pQVar2 = QGraphicsItem::toGraphicsObject
                       ((QGraphicsItem *)
                        CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60));
    if (pQVar2 == (QGraphicsObject *)0x0) {
      QDebug::operator<<((QDebug *)in_RSI,(char *)t);
    }
    else {
      (*(code *)**(undefined8 **)pQVar2)();
      QMetaObject::className();
      QDebug::operator<<((QDebug *)in_RSI,(char *)t);
    }
    QDebug::operator<<((QDebug *)CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60),
                       (char)((ulong)in_stack_ffffffffffffff58 >> 0x38));
    QDebug::operator<<((QDebug *)CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60),
                       in_stack_ffffffffffffff58);
    pQVar3 = qgraphicsitem_cast<QGraphicsProxyWidget_const*>(item_00);
    if (pQVar3 != (QGraphicsProxyWidget *)0x0) {
      QDebug::operator<<((QDebug *)in_RSI,(char *)t);
      in_stack_ffffffffffffff80 =
           QGraphicsProxyWidget::widget
                     ((QGraphicsProxyWidget *)
                      CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60));
      if (in_stack_ffffffffffffff80 == (QWidget *)0x0) {
        QDebug::operator<<((QDebug *)in_RSI,(char *)t);
      }
      else {
        (*(code *)**(undefined8 **)in_stack_ffffffffffffff80)();
        QMetaObject::className();
        QDebug::operator<<((QDebug *)in_RSI,(char *)t);
        QDebug::operator<<((QDebug *)CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60),
                           (char)((ulong)in_stack_ffffffffffffff58 >> 0x38));
        QDebug::operator<<((QDebug *)CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60),
                           in_stack_ffffffffffffff58);
        QObject::objectName();
        bVar1 = QString::isEmpty((QString *)0x99062c);
        in_stack_ffffffffffffff67 = bVar1 ^ 0xff;
        QString::~QString((QString *)0x99063f);
        if ((in_stack_ffffffffffffff67 & 1) != 0) {
          in_stack_ffffffffffffff58 = QDebug::operator<<((QDebug *)in_RSI,(char *)t);
          QObject::objectName();
          QDebug::operator<<((QDebug *)item_00,(QString *)in_RDI);
          QString::~QString((QString *)0x990685);
        }
        QDebug::operator<<((QDebug *)CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60),
                           (char)((ulong)in_stack_ffffffffffffff58 >> 0x38));
      }
    }
    QDebug::QDebug(local_48,(QDebug *)in_RSI);
    formatGraphicsItemHelper((QDebug *)in_stack_ffffffffffffff80,in_RSI);
    QDebug::~QDebug(local_48);
    QDebug::operator<<((QDebug *)CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60),
                       (char)((ulong)in_stack_ffffffffffffff58 >> 0x38));
    QDebug::QDebug((QDebug *)CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60),
                   in_stack_ffffffffffffff58);
  }
  QDebugStateSaver::~QDebugStateSaver((QDebugStateSaver *)&local_10);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (QDebug)(Stream *)item_00;
}

Assistant:

QDebug operator<<(QDebug debug, const QGraphicsItem *item)
{
    QDebugStateSaver saver(debug);
    debug.nospace();

    if (!item) {
        debug << "QGraphicsItem(0)";
        return debug;
    }

    if (const QGraphicsObject *o = item->toGraphicsObject())
        debug << o->metaObject()->className();
    else
        debug << "QGraphicsItem";
    debug << '(' << static_cast<const void *>(item);
    if (const QGraphicsProxyWidget *pw = qgraphicsitem_cast<const QGraphicsProxyWidget *>(item)) {
        debug << ", widget=";
        if (const QWidget *w = pw->widget()) {
            debug << w->metaObject()->className() << '(' << static_cast<const void *>(w);
            if (!w->objectName().isEmpty())
                debug << ", name=" << w->objectName();
            debug << ')';
        } else {
            debug << "QWidget(0)";
        }
    }
    formatGraphicsItemHelper(debug, item);
    debug << ')';
    return debug;
}